

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResultToJUnit.cpp
# Opt level: O0

void parseBatchResult(TestLogParser *parser,char *filename)

{
  int iVar1;
  int numRead;
  deUint8 local_a28 [8];
  deUint8 buf [2048];
  char local_220 [8];
  ifstream in;
  char *filename_local;
  TestLogParser *parser_local;
  
  std::ifstream::ifstream(local_220,filename,_S_bin);
  do {
    std::istream::read(local_220,(long)local_a28);
    iVar1 = std::istream::gcount();
    if (0 < iVar1) {
      xe::TestLogParser::parse(parser,local_a28,(long)iVar1);
    }
  } while (0x7ff < iVar1);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

static void parseBatchResult (xe::TestLogParser& parser, const char* filename)
{
	std::ifstream	in			(filename, std::ios_base::binary);
	deUint8			buf[2048];

	for (;;)
	{
		in.read((char*)&buf[0], sizeof(buf));
		int numRead = (int)in.gcount();

		if (numRead > 0)
			parser.parse(&buf[0], numRead);

		if (numRead < (int)sizeof(buf))
			break;
	}
}